

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::(anonymous_namespace)::CountingNetworkAddress> __thiscall
kj::
heap<kj::(anonymous_namespace)::CountingNetworkAddress,kj::Own<kj::NetworkAddress>,unsigned_int&,unsigned_int&>
          (kj *this,Own<kj::NetworkAddress> *params,uint *params_1,uint *params_2)

{
  CountingNetworkAddress *this_00;
  Own<kj::NetworkAddress> *other;
  uint *count;
  uint *addrCount;
  CountingNetworkAddress *extraout_RDX;
  Own<kj::(anonymous_namespace)::CountingNetworkAddress> OVar1;
  Own<kj::NetworkAddress> local_38;
  uint *local_28;
  uint *params_local_2;
  uint *params_local_1;
  Own<kj::NetworkAddress> *params_local;
  
  local_28 = params_2;
  params_local_2 = params_1;
  params_local_1 = (uint *)params;
  params_local = (Own<kj::NetworkAddress> *)this;
  this_00 = (CountingNetworkAddress *)operator_new(0x48);
  other = fwd<kj::Own<kj::NetworkAddress>>((NoInfer<kj::Own<kj::NetworkAddress>_> *)params_local_1);
  Own<kj::NetworkAddress>::Own(&local_38,other);
  count = fwd<unsigned_int&>(params_local_2);
  addrCount = fwd<unsigned_int&>(local_28);
  anon_unknown_0::CountingNetworkAddress::CountingNetworkAddress(this_00,&local_38,count,addrCount);
  Own<kj::(anonymous_namespace)::CountingNetworkAddress>::Own
            ((Own<kj::(anonymous_namespace)::CountingNetworkAddress> *)this,this_00,
             (Disposer *)
             &_::HeapDisposer<kj::(anonymous_namespace)::CountingNetworkAddress>::instance);
  Own<kj::NetworkAddress>::~Own(&local_38);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}